

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_remove_key(qpdf_data qpdf,qpdf_oh oh,char *key)

{
  anon_class_8_1_ba1d59bf local_48;
  function<void_(QPDFObjectHandle_&)> local_40;
  char *local_20;
  char *key_local;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_48.key = key;
  local_20 = key;
  key_local._4_4_ = oh;
  p_Stack_10 = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_remove_key::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_40,&local_48);
  do_with_oh_void(qpdf,oh,&local_40);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_40);
  return;
}

Assistant:

void
qpdf_oh_remove_key(qpdf_data qpdf, qpdf_oh oh, char const* key)
{
    do_with_oh_void(qpdf, oh, [key](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_remove_key");
        o.removeKey(key);
    });
}